

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O2

int bassignblk(bstring a,void *s,int len)

{
  int iVar1;
  int iVar2;
  uchar *__dest;
  
  iVar2 = -1;
  if ((((a != (bstring)0x0) && (__dest = a->data, __dest != (uchar *)0x0)) &&
      (iVar1 = a->mlen, -1 < a->slen && a->slen <= iVar1)) &&
     ((((uint)len < 0x7fffffff && (s != (void *)0x0)) && (iVar1 != 0)))) {
    if (iVar1 <= len) {
      iVar2 = balloc(a,len + 1);
      if (iVar2 < 0) {
        return -1;
      }
      __dest = a->data;
    }
    if (len != 0) {
      memmove(__dest,s,(ulong)(uint)len);
      __dest = a->data;
    }
    __dest[(uint)len] = '\0';
    a->slen = len;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int bassignblk (bstring a, const void * s, int len) {
	if (a == NULL || a->data == NULL || a->mlen < a->slen ||
	    a->slen < 0 || a->mlen == 0 || NULL == s || len < 0 || len >= INT_MAX)
		return BSTR_ERR;
	if (len + 1 > a->mlen && 0 > balloc (a, len + 1)) return BSTR_ERR;
	bBlockCopy (a->data, s, (size_t) len);
	a->data[len] = (unsigned char) '\0';
	a->slen = len;
	return BSTR_OK;
}